

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_encode_utils.c
# Opt level: O0

int VP8LCreateCompressedHuffmanTree(HuffmanTreeCode *tree,HuffmanTreeToken *tokens,int max_tokens)

{
  int iVar1;
  uint value_00;
  HuffmanTreeToken *in_RSI;
  int *in_RDI;
  bool bVar2;
  int runs;
  int k;
  int value;
  int i;
  int prev_value;
  int depth_size;
  HuffmanTreeToken *ending_token;
  HuffmanTreeToken *starting_token;
  int local_3c;
  int local_34;
  uint local_30;
  HuffmanTreeToken *local_10;
  
  iVar1 = *in_RDI;
  local_30 = 8;
  local_10 = in_RSI;
  for (local_34 = 0; local_34 < iVar1; local_34 = local_3c + local_34) {
    value_00 = (uint)*(byte *)(*(long *)(in_RDI + 2) + (long)local_34);
    local_3c = local_34;
    do {
      local_3c = local_3c + 1;
      bVar2 = false;
      if (local_3c < iVar1) {
        bVar2 = *(byte *)(*(long *)(in_RDI + 2) + (long)local_3c) == value_00;
      }
    } while (bVar2);
    local_3c = local_3c - local_34;
    if (value_00 == 0) {
      local_10 = CodeRepeatedZeros(local_3c,local_10);
    }
    else {
      local_10 = CodeRepeatedValues(local_3c,local_10,value_00,local_30);
      local_30 = value_00;
    }
  }
  return (int)((long)local_10 - (long)in_RSI >> 1);
}

Assistant:

int VP8LCreateCompressedHuffmanTree(const HuffmanTreeCode* const tree,
                                    HuffmanTreeToken* tokens, int max_tokens) {
  HuffmanTreeToken* const starting_token = tokens;
  HuffmanTreeToken* const ending_token = tokens + max_tokens;
  const int depth_size = tree->num_symbols;
  int prev_value = 8;  // 8 is the initial value for rle.
  int i = 0;
  assert(tokens != NULL);
  while (i < depth_size) {
    const int value = tree->code_lengths[i];
    int k = i + 1;
    int runs;
    while (k < depth_size && tree->code_lengths[k] == value) ++k;
    runs = k - i;
    if (value == 0) {
      tokens = CodeRepeatedZeros(runs, tokens);
    } else {
      tokens = CodeRepeatedValues(runs, tokens, value, prev_value);
      prev_value = value;
    }
    i += runs;
    assert(tokens <= ending_token);
  }
  (void)ending_token;    // suppress 'unused variable' warning
  return (int)(tokens - starting_token);
}